

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::CopyFaceIndicesLWOB
          (LWOImporter *this,iterator *it,uint16_t **cursor,uint16_t *end,uint max)

{
  uint uVar1;
  ushort *puVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  reference pFVar5;
  ulong uVar6;
  uint *puVar7;
  size_type sVar8;
  Logger *pLVar9;
  uint16_t local_4c;
  uint16_t numPolygons;
  int16_t surface;
  uint16_t index;
  uint *mi;
  uint i;
  uint16_t numIndices;
  Face *face;
  uint max_local;
  uint16_t *end_local;
  uint16_t **cursor_local;
  iterator *it_local;
  LWOImporter *this_local;
  
  face._4_4_ = max;
  while( true ) {
    uVar1 = face._4_4_;
    if (*cursor < end) {
      face._4_4_ = face._4_4_ - 1;
    }
    if (*cursor >= end || uVar1 == 0) break;
    pFVar5 = __gnu_cxx::
             __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
             ::operator*(it);
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
    ::operator++(it);
    puVar2 = *cursor;
    *cursor = puVar2 + 1;
    (pFVar5->super_aiFace).mNumIndices = (uint)*puVar2;
    if ((pFVar5->super_aiFace).mNumIndices == 0) {
      pLVar9 = DefaultLogger::get();
      Logger::warn(pLVar9,"LWOB: Face has 0 indices");
    }
    else {
      if (end <= *cursor + (pFVar5->super_aiFace).mNumIndices) {
        return;
      }
      auVar4 = ZEXT416((pFVar5->super_aiFace).mNumIndices) * ZEXT816(4);
      uVar6 = auVar4._0_8_;
      if (auVar4._8_8_ != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      puVar7 = (uint *)operator_new__(uVar6);
      (pFVar5->super_aiFace).mIndices = puVar7;
      for (mi._0_4_ = 0; (uint)mi < (pFVar5->super_aiFace).mNumIndices; mi._0_4_ = (uint)mi + 1) {
        puVar7 = (pFVar5->super_aiFace).mIndices + (uint)mi;
        puVar2 = *cursor;
        *cursor = puVar2 + 1;
        *puVar7 = (uint)*puVar2;
        uVar1 = *puVar7;
        sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&this->mCurLayer->mTempPoints);
        if (sVar8 < uVar1) {
          pLVar9 = DefaultLogger::get();
          Logger::warn(pLVar9,"LWOB: face index is out of range");
          sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            (&this->mCurLayer->mTempPoints);
          *puVar7 = (int)sVar8 - 1;
        }
      }
    }
    puVar3 = *cursor;
    *cursor = puVar3 + 1;
    local_4c = *puVar3;
    if ((short)local_4c < 0) {
      local_4c = -local_4c;
      puVar2 = *cursor;
      *cursor = puVar2 + 1;
      if (*cursor < end) {
        CopyFaceIndicesLWOB(this,it,cursor,end,(uint)*puVar2);
      }
    }
    pFVar5->surfaceIndex = (int)(short)local_4c - 1;
  }
  return;
}

Assistant:

void LWOImporter::CopyFaceIndicesLWOB(FaceList::iterator& it,
    LE_NCONST uint16_t*& cursor,
    const uint16_t* const end,
    unsigned int max)
{
    while (cursor < end && max--)
    {
        LWO::Face& face = *it;++it;
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        face.mNumIndices = numIndices;
        if(face.mNumIndices)
        {
            if (cursor + face.mNumIndices >= end)
            {
                break;
            }
            face.mIndices = new unsigned int[face.mNumIndices];
            for (unsigned int i = 0; i < face.mNumIndices;++i) {
                unsigned int & mi = face.mIndices[i];
                uint16_t index;
                ::memcpy(&index, cursor++, 2);
                mi = index;
                if (mi > mCurLayer->mTempPoints.size())
                {
                    ASSIMP_LOG_WARN("LWOB: face index is out of range");
                    mi = (unsigned int)mCurLayer->mTempPoints.size()-1;
                }
            }
        } else {
            ASSIMP_LOG_WARN("LWOB: Face has 0 indices");
        }
        int16_t surface;
        ::memcpy(&surface, cursor++, 2);
        if (surface < 0)
        {
            surface = -surface;

            // there are detail polygons.
            uint16_t numPolygons;
            ::memcpy(&numPolygons, cursor++, 2);
            if (cursor < end)
            {
                CopyFaceIndicesLWOB(it,cursor,end,numPolygons);
            }
        }
        face.surfaceIndex = surface-1;
    }
}